

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
brotli::MoveToFrontTransform
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  uint uVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var3;
  ulong uVar4;
  size_t index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mtf;
  allocator_type local_39;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if ((v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__,v);
  }
  else {
    _Var3 = std::
            __max_element<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
    uVar1 = *_Var3._M_current;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,(ulong)(uVar1 + 1),
               &local_39);
    for (uVar4 = 0; uVar1 + 1 != uVar4; uVar4 = uVar4 + 1) {
      local_38._M_impl.super__Vector_impl_data._M_start[uVar4] = (uint)uVar4;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_39);
    for (uVar4 = 0;
        puVar2 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
        uVar4 = uVar4 + 1) {
      index = IndexOf((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,puVar2[uVar4]
                     );
      if ((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_38._M_impl.super__Vector_impl_data._M_start >> 2) <= index) {
        __assert_fail("index < mtf.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/brotli_bit_stream.cc"
                      ,0x1ed,
                      "std::vector<uint32_t> brotli::MoveToFrontTransform(const std::vector<uint32_t> &)"
                     );
      }
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar4] = (uint)index;
      MoveToFront((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,index);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MoveToFrontTransform(const std::vector<uint32_t>& v) {
  if (v.empty()) return v;
  uint32_t max_value = *std::max_element(v.begin(), v.end());
  std::vector<uint32_t> mtf(max_value + 1);
  for (uint32_t i = 0; i <= max_value; ++i) mtf[i] = i;
  std::vector<uint32_t> result(v.size());
  for (size_t i = 0; i < v.size(); ++i) {
    size_t index = IndexOf(mtf, v[i]);
    assert(index < mtf.size());
    result[i] = static_cast<uint32_t>(index);
    MoveToFront(&mtf, index);
  }
  return result;
}